

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTPNCodeBody::show_disassembly
          (CTPNCodeBody *this,unsigned_long start_ofs,unsigned_long code_start_ofs,
          unsigned_long code_end_ofs)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  byte bVar9;
  char **ppcVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  CTcUnasSrcCodeBody exc_src;
  CTcUnasSrcCodeBody src;
  CTcUnasSrc local_70;
  CTcCodeStream *local_68;
  long local_60;
  ulong local_58;
  CTcUnasSrc local_50;
  CTcCodeStream *local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  ppcVar10 = (G_cs->super_CTcDataStream).pages_;
  bVar1 = ppcVar10[start_ofs / 65000][start_ofs % 65000];
  uVar12 = (start_ofs + 2) / 65000;
  cVar2 = ppcVar10[uVar12][uVar12 * -65000 + start_ofs + 2];
  uVar12 = (start_ofs + 3) / 65000;
  cVar3 = ppcVar10[uVar12][uVar12 * -65000 + start_ofs + 3];
  uVar12 = (start_ofs + 4) / 65000;
  cVar4 = ppcVar10[uVar12][uVar12 * -65000 + start_ofs + 4];
  uVar12 = (start_ofs + 5) / 65000;
  cVar5 = ppcVar10[uVar12][uVar12 * -65000 + start_ofs + 5];
  uVar12 = (start_ofs + 6) / 65000;
  cVar6 = ppcVar10[uVar12][uVar12 * -65000 + start_ofs + 6];
  uVar12 = (start_ofs + 7) / 65000;
  cVar7 = ppcVar10[uVar12][uVar12 * -65000 + start_ofs + 7];
  uVar12 = (start_ofs + 8) / 65000;
  bVar8 = ppcVar10[uVar12][uVar12 * -65000 + start_ofs + 8];
  uVar12 = (start_ofs + 9) / 65000;
  bVar9 = ppcVar10[uVar12][uVar12 * -65000 + start_ofs + 9];
  (*G_disasm_out->_vptr_CTcUnasOut[2])(G_disasm_out,"%8lx .code\n",start_ofs);
  pcVar11 = "+";
  if (-1 < (char)bVar1) {
    pcVar11 = "";
  }
  (*G_disasm_out->_vptr_CTcUnasOut[2])
            (G_disasm_out,"         .argcount %d%s\n",(ulong)(bVar1 & 0x7f),pcVar11);
  (*G_disasm_out->_vptr_CTcUnasOut[2])
            (G_disasm_out,"         .locals %d\n",(ulong)CONCAT11(cVar3,cVar2));
  (*G_disasm_out->_vptr_CTcUnasOut[2])
            (G_disasm_out,"         .maxstack %d\n",(ulong)CONCAT11(cVar5,cVar4));
  local_50._vptr_CTcUnasSrc = (_func_int **)&PTR__CTcUnasSrc_00322138;
  local_48 = G_cs;
  local_40 = code_start_ofs;
  local_38 = code_end_ofs;
  CTcT3Unasm::disasm(&local_50,G_disasm_out);
  if (CONCAT11(cVar7,cVar6) != 0) {
    uVar13 = (uint)bVar9 * 0x100 + (uint)bVar8;
    if (uVar13 == 0) {
      uVar14 = (G_cs->super_CTcDataStream).ofs_;
    }
    else {
      uVar14 = uVar13 + start_ofs;
    }
    (*G_disasm_out->_vptr_CTcUnasOut[2])(G_disasm_out,".exceptions\n");
    local_70._vptr_CTcUnasSrc = (_func_int **)&PTR__CTcUnasSrc_00322138;
    local_68 = G_cs;
    local_60 = (uint)CONCAT11(cVar7,cVar6) + start_ofs;
    local_58 = uVar14;
    CTcT3Unasm::show_exc_table(&local_70,G_disasm_out,start_ofs);
  }
  (*G_disasm_out->_vptr_CTcUnasOut[2])(G_disasm_out,"\n");
  return;
}

Assistant:

void CTPNCodeBody::show_disassembly(unsigned long start_ofs,
                                    unsigned long code_start_ofs,
                                    unsigned long code_end_ofs)
{
    int argc;
    int locals;
    int total_stk;
    unsigned exc_rel;
    unsigned dbg_rel;

    /* first, dump the header */
    argc = (unsigned char)G_cs->get_byte_at(start_ofs);
    locals = G_cs->readu2_at(start_ofs + 2);
    total_stk = G_cs->readu2_at(start_ofs + 4);
    exc_rel = G_cs->readu2_at(start_ofs + 6);
    dbg_rel = G_cs->readu2_at(start_ofs + 8);
    G_disasm_out->print("%8lx .code\n", start_ofs);
    G_disasm_out->print("         .argcount %d%s\n",
                        (argc & 0x7f),
                        (argc & 0x80) != 0 ? "+" : "");
    G_disasm_out->print("         .locals %d\n", locals);
    G_disasm_out->print("         .maxstack %d\n", total_stk);

    /* set up a code stream reader and dump the code stream */
    CTcUnasSrcCodeBody src(G_cs, code_start_ofs, code_end_ofs);
    CTcT3Unasm::disasm(&src, G_disasm_out);

    /* show the exception table, if there is one */
    if (exc_rel != 0)
    {
        unsigned long exc_ofs;
        unsigned long exc_end_ofs;

        /* get the starting address */
        exc_ofs = start_ofs + exc_rel;

        /* 
         *   get the length - it's the part up to the debug records, or the
         *   part up to the current code offset if there are no debug records
         */
        exc_end_ofs = (dbg_rel != 0 ? start_ofs + dbg_rel : G_cs->get_ofs());

        /* show the table */
        G_disasm_out->print(".exceptions\n");
        CTcUnasSrcCodeBody exc_src(G_cs, exc_ofs, exc_end_ofs);
        CTcT3Unasm::show_exc_table(&exc_src, G_disasm_out, start_ofs);
    }

    /* add a blank line at the end */
    G_disasm_out->print("\n");
}